

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.cpp
# Opt level: O0

int __thiscall regex::Interval::CompareTo(Interval *this,Interval other)

{
  Interval *this_local;
  int iStack_10;
  Interval other_local;
  
  this_local._4_4_ = other.begin;
  if (this->begin < this_local._4_4_) {
    other_local.begin = -1;
  }
  else if (this->begin == this_local._4_4_) {
    iStack_10 = other.end;
    if (this->end < iStack_10) {
      other_local.begin = -1;
    }
    else if (this->end == iStack_10) {
      other_local.begin = 0;
    }
    else {
      other_local.begin = 1;
    }
  }
  else {
    other_local.begin = 1;
  }
  return other_local.begin;
}

Assistant:

int Interval::CompareTo(Interval other)
    {
        if (begin < other.begin)
        {
            return -1;
        }
        else if (begin == other.begin)
        {
            if (end < other.end)
            {
                return -1;
            }
            else if (end == other.end)
            {
                return 0;
            }
            else
            {
                return 1;
            }
        }
        else
        {
            return 1;
        }
    }